

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::objectivec::FileClassPrefix_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FileDescriptor *file)

{
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
  *prVar1;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
  *this_00;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *this_01;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  bool bVar5;
  anon_union_8_1_a8a14541_for_iterator_2 aVar6;
  ostream *poVar7;
  pointer prVar8;
  undefined8 *puVar9;
  long *plVar10;
  slot_type *psVar11;
  AlphaNum *pAVar12;
  pointer pbVar13;
  AlphaNum *in_R8;
  size_type sVar14;
  char *pcVar15;
  char *pcVar16;
  iterator iVar17;
  string_view input;
  string_view path;
  string_view path_00;
  string result;
  iterator prefix_lookup;
  string error_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  segments;
  size_type __dnew;
  SimpleLineCollector collector_1;
  undefined1 local_140 [16];
  undefined1 local_130 [32];
  undefined1 local_110 [16];
  undefined1 local_100 [24];
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_e8;
  string local_e0;
  undefined1 local_c0 [16];
  undefined1 local_b0 [32];
  anon_union_8_1_a8a14541_for_iterator_2 local_90;
  AlphaNum *local_88;
  pointer local_80;
  long lStack_78;
  string local_60;
  LineConsumer local_40;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
  *local_38;
  
  pcVar16 = (anonymous_namespace)::g_prefix_mode;
  if ((*(byte *)(*(long *)(this + 0x80) + 0x28) & 8) != 0) {
    plVar10 = (long *)(*(ulong *)(*(long *)(this + 0x80) + 0x60) & 0xfffffffffffffffc);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar2 = *plVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar2,plVar10[1] + lVar2);
    return __return_storage_ptr__;
  }
  this_01 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             *)((anonymous_namespace)::g_prefix_mode + 8);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)this_01);
  if ((*(ulong *)(pcVar16 + 0x10) < 2) && (*(long *)(pcVar16 + 0x30) != 0)) {
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    local_110._8_8_ = (slot_type *)(local_100 + 8);
    local_110._0_8_ = &PTR__PackageToPrefixesCollector_0190e988;
    local_90 = (anon_union_8_1_a8a14541_for_iterator_2)0x13;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    aVar6.slot_ = (slot_type *)
                  std::__cxx11::string::_M_create((ulong *)(local_110 + 8),(ulong)&local_90);
    local_100._8_8_ = local_90;
    *(undefined8 *)aVar6.slot_ = 0x206567616b636150;
    builtin_strncpy((char *)((long)aVar6.slot_ + 8),"to prefi",8);
    builtin_strncpy((char *)((long)aVar6.slot_ + 0xf),"ixes",4);
    local_100._0_8_ = local_90;
    *(char *)((long)aVar6.slot_ + (long)local_90.slot_) = '\0';
    path._M_str = *(char **)(pcVar16 + 0x28);
    path._M_len = *(size_t *)(pcVar16 + 0x30);
    local_e8 = this_01;
    local_110._8_8_ = aVar6.slot_;
    bVar5 = ParseSimpleFile(path,(LineConsumer *)local_110,&local_e0);
    if (!bVar5) {
      if (local_e0._M_string_length == 0) {
        local_90 = (anon_union_8_1_a8a14541_for_iterator_2)0x23;
        local_88 = (AlphaNum *)0x12f6a94;
        local_140._0_8_ =
             (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
              *)0x27;
        local_140._8_8_ = "prefix to proto package mappings file: ";
        local_c0._8_8_ = *(undefined8 *)(pcVar16 + 0x28);
        local_c0._0_8_ = *(undefined8 *)(pcVar16 + 0x30);
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_60,(lts_20250127 *)&local_90,(AlphaNum *)local_140,(AlphaNum *)local_c0,
                   in_R8);
        std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_e0._M_dataplus._M_p,local_e0._M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::ostream::flush();
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::clear((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)this_01);
    }
    local_110._0_8_ = &PTR__PackageToPrefixesCollector_0190e988;
    if ((slot_type *)local_110._8_8_ != (slot_type *)(local_100 + 8)) {
      operator_delete((void *)local_110._8_8_,local_100._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,
                      CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                               local_e0.field_2._M_local_buf[0]) + 1);
    }
  }
  lVar2 = (*(long **)(this + 0x10))[1];
  if (lVar2 == 0) {
    local_110._8_8_ = "no_package:";
    local_110._0_8_ = &DAT_0000000b;
    local_88 = (AlphaNum *)**(undefined8 **)(this + 8);
    local_90 = *(anon_union_8_1_a8a14541_for_iterator_2 *)(*(undefined8 **)(this + 8) + 1);
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_140,(lts_20250127 *)local_110,(AlphaNum *)&local_90,local_88);
  }
  else {
    lVar3 = **(long **)(this + 0x10);
    local_140._0_8_ = local_130;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_140,lVar3,lVar2 + lVar3);
  }
  local_110 = (undefined1  [16])
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::find<std::__cxx11::string>
                        (this_01,(key_arg<std::__cxx11::basic_string<char>_> *)local_140);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)this_01);
  local_90.slot_ = (slot_type *)0x0;
  bVar5 = absl::lts_20250127::container_internal::operator==
                    ((iterator *)local_110,(iterator *)&local_90);
  if (bVar5) {
    pcVar16 = anon_var_dwarf_a22956 + 5;
    sVar14 = 0;
  }
  else {
    prVar8 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::iterator::operator->((iterator *)local_110);
    pcVar16 = (prVar8->second)._M_dataplus._M_p;
    sVar14 = (prVar8->second)._M_string_length;
  }
  if ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
       *)local_140._0_8_ !=
      (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
       *)local_130) {
    operator_delete((void *)local_140._0_8_,local_130._0_8_ + 1);
  }
  pcVar15 = (anonymous_namespace)::g_prefix_mode;
  if (sVar14 != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar15 = pcVar16 + sVar14;
    goto LAB_00dfed17;
  }
  if (*(anonymous_namespace)::g_prefix_mode != '\0') {
    local_60._M_string_length = **(size_type **)(this + 0x10);
    local_60._M_dataplus._M_p = (pointer)(*(size_type **)(this + 0x10))[1];
    this_00 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
               *)((anonymous_namespace)::g_prefix_mode + 0x88);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00);
    if ((*(ulong *)(pcVar15 + 0x90) < 2) && (*(size_t *)(pcVar15 + 0x50) != 0)) {
      local_110._8_8_ = 0;
      local_110._0_8_ = local_100;
      local_100._0_8_ = local_100._0_8_ & 0xffffffffffffff00;
      local_40._vptr_LineConsumer = (_func_int **)&PTR__LineConsumer_0190e9c8;
      path_00._M_str = *(char **)(pcVar15 + 0x48);
      path_00._M_len = *(size_t *)(pcVar15 + 0x50);
      local_38 = this_00;
      bVar5 = ParseSimpleFile(path_00,&local_40,(string *)local_110);
      if (!bVar5) {
        if ((slot_type *)local_110._8_8_ == (slot_type *)0x0) {
          local_c0._0_8_ = (AlphaNum *)local_b0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c0,"protoc:0: warning: Failed to parse","");
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0," package prefix exceptions file: ","");
          pbVar13 = (pointer)&DAT_0000000f;
          if ((AlphaNum *)local_c0._0_8_ != (AlphaNum *)local_b0) {
            pbVar13 = (pointer)local_b0._0_8_;
          }
          in_R8 = (AlphaNum *)local_c0._8_8_;
          if (pbVar13 < (pointer)((char *)(local_c0._8_8_ + 0x10) +
                                 (local_e0._M_string_length - 0x10))) {
            pbVar13 = (pointer)&DAT_0000000f;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              pbVar13 = (pointer)CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                          local_e0.field_2._M_local_buf[0]);
            }
            if (pbVar13 < (pointer)((char *)(local_c0._8_8_ + 0x10) +
                                   (local_e0._M_string_length - 0x10))) goto LAB_00dfeaf3;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,local_c0._0_8_);
          }
          else {
LAB_00dfeaf3:
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append(local_c0,(ulong)local_e0._M_dataplus._M_p);
          }
          prVar1 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                    *)(puVar9 + 2);
          if ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
               *)*puVar9 == prVar1) {
            local_130._0_8_ = *(undefined8 *)prVar1;
            local_130._8_8_ = puVar9[3];
            local_140._0_8_ =
                 (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                  *)local_130;
          }
          else {
            local_130._0_8_ = *(undefined8 *)prVar1;
            local_140._0_8_ =
                 (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                  *)*puVar9;
          }
          local_140._8_8_ = puVar9[1];
          *puVar9 = prVar1;
          puVar9[1] = 0;
          *prVar1 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                     )0x0;
          plVar10 = (long *)std::__cxx11::string::_M_append(local_140,*(ulong *)(pcVar15 + 0x48));
          psVar11 = (slot_type *)(plVar10 + 2);
          if ((slot_type *)*plVar10 == psVar11) {
            local_80 = (psVar11->value).first._M_dataplus._M_p;
            lStack_78 = plVar10[3];
            local_90.slot_ = (slot_type *)&local_80;
          }
          else {
            local_80 = (psVar11->value).first._M_dataplus._M_p;
            local_90.slot_ = (slot_type *)*plVar10;
          }
          local_88 = (AlphaNum *)plVar10[1];
          *plVar10 = (long)psVar11;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::operator=((string *)local_110,(string *)&local_90);
          if (local_90.slot_ != (slot_type *)&local_80) {
            operator_delete(local_90.slot_,(ulong)(local_80 + 1));
          }
          if ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
               *)local_140._0_8_ !=
              (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
               *)local_130) {
            operator_delete((void *)local_140._0_8_,local_130._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,
                            CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                     local_e0.field_2._M_local_buf[0]) + 1);
          }
          if ((AlphaNum *)local_c0._0_8_ != (AlphaNum *)local_b0) {
            operator_delete((void *)local_c0._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_b0._0_8_)->_M_p + 1));
          }
        }
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_110._0_8_,local_110._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        std::ostream::flush();
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
      }
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_00);
      if (*(ulong *)(pcVar15 + 0x90) < 2) {
        local_140._0_8_ = this_00;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
        ::EmplaceDecomposable::operator()
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
                    *)&local_90,local_140,(char (*) [21])"<not a real package>",
                   (char (*) [21])"<not a real package>");
      }
      if ((undefined1 *)local_110._0_8_ != local_100) {
        operator_delete((void *)local_110._0_8_,local_100._0_8_ + 1);
      }
    }
    iVar17 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
             ::find<std::basic_string_view<char,std::char_traits<char>>>
                       (this_00,(key_arg<std::basic_string_view<char>_> *)&local_60);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00);
    if (iVar17.ctrl_ == (ctrl_t *)0x0) {
      local_140._8_8_ = (slot_type *)0x0;
      local_130._0_8_ = local_130._0_8_ & 0xffffffffffffff00;
      local_110._8_8_ = (*(anon_union_8_1_a8a14541_for_iterator_2 **)(this + 0x10))->slot_;
      local_110._0_8_ = (*(anon_union_8_1_a8a14541_for_iterator_2 **)(this + 0x10))[1].slot_;
      local_100[0] = 0x2e;
      local_140._0_8_ = (AlphaNum *)local_130;
      absl::lts_20250127::strings_internal::
      Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::
      ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ::operator()((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_c0,
                   (ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    *)&local_90,
                   (Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *)local_110);
      uVar4 = local_c0._8_8_;
      if (local_c0._0_8_ != local_c0._8_8_) {
        pAVar12 = (AlphaNum *)local_c0._0_8_;
        do {
          input._M_str = (char *)0x1;
          input._M_len = (pAVar12->piece_)._M_len;
          (anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                    ((string *)local_110,(_anonymous_namespace_ *)(pAVar12->piece_)._M_str,input,
                     SUB81(in_R8,0));
          if ((slot_type *)local_110._8_8_ != (slot_type *)0x0) {
            if ((slot_type *)local_140._8_8_ != (slot_type *)0x0) {
              std::__cxx11::string::append(local_140);
            }
            std::__cxx11::string::_M_append(local_140,local_110._0_8_);
          }
          if ((undefined1 *)local_110._0_8_ != local_100) {
            operator_delete((void *)local_110._0_8_,local_100._0_8_ + 1);
          }
          pAVar12 = (AlphaNum *)(pAVar12->digits_ + 0x10);
        } while (pAVar12 != (AlphaNum *)uVar4);
      }
      if ((slot_type *)local_140._8_8_ == (slot_type *)0x0) {
        local_90.slot_ = (slot_type *)0x0;
      }
      else {
        std::__cxx11::string::append(local_140);
        local_90 = (anon_union_8_1_a8a14541_for_iterator_2)local_140._8_8_;
      }
      local_110._8_8_ =
           ((anon_union_8_1_a8a14541_for_iterator_2 *)((anonymous_namespace)::g_prefix_mode + 0x68))
           ->slot_;
      local_110._0_8_ = *(ctrl_t **)((anonymous_namespace)::g_prefix_mode + 0x70);
      local_88 = (AlphaNum *)local_140._0_8_;
      absl::lts_20250127::StrCat_abi_cxx11_
                (__return_storage_ptr__,(lts_20250127 *)local_110,(AlphaNum *)&local_90,
                 (AlphaNum *)local_140._0_8_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_c0);
      if ((AlphaNum *)local_140._0_8_ == (AlphaNum *)local_130) {
        return __return_storage_ptr__;
      }
      operator_delete((void *)local_140._0_8_,local_130._0_8_ + 1);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar15 = anon_var_dwarf_a22956 + 5;
  pcVar16 = anon_var_dwarf_a22956 + 5;
LAB_00dfed17:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar16,pcVar15);
  return __return_storage_ptr__;
}

Assistant:

std::string FileClassPrefix(const FileDescriptor* file) {
  // Always honor the file option.
  if (file->options().has_objc_class_prefix()) {
    return file->options().objc_class_prefix();
  }

  // If package prefix is specified in an prefix to proto mappings file then use
  // that.
  absl::string_view objc_class_prefix =
      g_prefix_mode.prefix_from_proto_package_mappings(file);
  if (!objc_class_prefix.empty()) {
    return std::string(objc_class_prefix);
  }

  // If package prefix isn't enabled, done.
  if (!g_prefix_mode.use_package_name()) {
    return "";
  }

  // If the package is in the exceptions list, done.
  if (g_prefix_mode.is_package_exempted(file->package())) {
    return "";
  }

  // Transform the package into a prefix: use the dot segments as part,
  // camelcase each one and then join them with underscores, and add an
  // underscore at the end.
  std::string result;
  const std::vector<std::string> segments =
      absl::StrSplit(file->package(), '.', absl::SkipEmpty());
  for (const auto& segment : segments) {
    const std::string part = UnderscoresToCamelCase(segment, true);
    if (part.empty()) {
      continue;
    }
    if (!result.empty()) {
      result.append("_");
    }
    result.append(part);
  }
  if (!result.empty()) {
    result.append("_");
  }
  return absl::StrCat(g_prefix_mode.forced_package_prefix(), result);
}